

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::skip_space
          (basic_json_parser<char,_std::allocator<char>_> *this,char_type **ptr)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar5;
  char *pcVar6;
  size_t sVar4;
  
  sVar2 = this->line_;
  sVar4 = this->position_;
  pcVar5 = *ptr;
LAB_0019a526:
  do {
    sVar3 = sVar4 + 1;
    pcVar6 = pcVar5 + 1;
    if (this->end_input_ <= pcVar5) {
LAB_0019a596:
      *ptr = pcVar5;
      return;
    }
    cVar1 = *pcVar5;
    if ((cVar1 == '\t') || (cVar1 == ' ')) {
      this->position_ = sVar3;
      sVar4 = sVar3;
      pcVar5 = pcVar6;
      goto LAB_0019a526;
    }
    if (cVar1 == '\n') {
      this->line_ = sVar2 + 1;
LAB_0019a577:
      this->position_ = sVar3;
    }
    else {
      if (cVar1 != '\r') goto LAB_0019a596;
      this->position_ = sVar3;
      if (this->end_input_ <= pcVar6) {
        push_state(this,this->state_);
        this->state_ = cr;
        pcVar5 = pcVar6;
        goto LAB_0019a596;
      }
      this->line_ = sVar2 + 1;
      if (*pcVar6 == '\n') {
        pcVar6 = pcVar5 + 2;
        sVar3 = sVar4 + 2;
        goto LAB_0019a577;
      }
    }
    sVar2 = sVar2 + 1;
    this->mark_position_ = sVar3;
    sVar4 = sVar3;
    pcVar5 = pcVar6;
  } while( true );
}

Assistant:

void skip_space(char_type const ** ptr)
    {
        const char_type* local_input_end = end_input_;
        const char_type* cur = *ptr;

        while (cur < local_input_end) 
        {
            if (*cur == ' ' || *cur == '\t')
            {
                ++cur;
                ++position_;
                continue;
            }
            if (*cur == '\n')
            {
                ++cur;
                ++line_;
                ++position_;
                mark_position_ = position_;
                continue;
            }
            if (*cur == '\r')
            {
                ++cur;
                ++position_;
                if (cur < local_input_end)
                {
                    ++line_;
                    if (*cur == '\n')
                    {
                        ++cur;
                        ++position_;
                    }
                    mark_position_ = position_;
                }
                else
                {
                    push_state(state_);
                    state_ = parse_state::cr;
                    *ptr = cur;
                    return; 
                }
                continue;
            }
            break;
        }
        *ptr = cur;
    }